

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

void __thiscall DElevator::Tick(DElevator *this)

{
  double dest;
  double dest_00;
  double oldceiling;
  double oldfloor;
  EMoveResult res;
  DElevator *this_local;
  
  dest = secplane_t::fD(&((this->super_DMover).super_DSectorEffect.m_Sector)->floorplane);
  dest_00 = secplane_t::fD(&((this->super_DMover).super_DSectorEffect.m_Sector)->ceilingplane);
  if (this->m_Direction < 0) {
    oldfloor._4_4_ =
         sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                             this->m_Speed,this->m_FloorDestDist,this->m_Direction);
    if (((oldfloor._4_4_ == ok) || (oldfloor._4_4_ == pastdest)) &&
       (oldfloor._4_4_ =
             sector_t::MoveCeiling
                       ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_Speed,
                        this->m_CeilingDestDist,this->m_Direction), oldfloor._4_4_ == crushed)) {
      sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                          this->m_Speed,dest,-this->m_Direction);
    }
  }
  else {
    oldfloor._4_4_ =
         sector_t::MoveCeiling
                   ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_Speed,
                    this->m_CeilingDestDist,this->m_Direction);
    if (((oldfloor._4_4_ == ok) || (oldfloor._4_4_ == pastdest)) &&
       (oldfloor._4_4_ =
             sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                                 this->m_Speed,this->m_FloorDestDist,this->m_Direction),
       oldfloor._4_4_ == crushed)) {
      sector_t::MoveCeiling
                ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_Speed,dest_00
                 ,-this->m_Direction);
    }
  }
  if (oldfloor._4_4_ == pastdest) {
    SN_StopSequence((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,1);
    TObjPtr<DSectorEffect>::operator=
              (&((this->super_DMover).super_DSectorEffect.m_Sector)->floordata,(DSectorEffect *)0x0)
    ;
    TObjPtr<DSectorEffect>::operator=
              (&((this->super_DMover).super_DSectorEffect.m_Sector)->ceilingdata,
               (DSectorEffect *)0x0);
    (*(this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])();
  }
  return;
}

Assistant:

void DElevator::Tick ()
{
	EMoveResult res;

	double oldfloor, oldceiling;

	oldfloor = m_Sector->floorplane.fD();
	oldceiling = m_Sector->ceilingplane.fD();

	if (m_Direction < 0)	// moving down
	{
		res = m_Sector->MoveFloor (m_Speed, m_FloorDestDist, m_Direction);
		if (res == EMoveResult::ok || res == EMoveResult::pastdest)
		{
			res = m_Sector->MoveCeiling (m_Speed, m_CeilingDestDist, m_Direction);
			if (res == EMoveResult::crushed)
			{
				m_Sector->MoveFloor (m_Speed, oldfloor, -m_Direction);
			}
		}
	}
	else // up
	{
		res = m_Sector->MoveCeiling (m_Speed, m_CeilingDestDist, m_Direction);
		if (res == EMoveResult::ok || res == EMoveResult::pastdest)
		{
			res = m_Sector->MoveFloor (m_Speed, m_FloorDestDist, m_Direction);
			if (res == EMoveResult::crushed)
			{
				m_Sector->MoveCeiling (m_Speed, oldceiling, -m_Direction);
			}
		}
	}

	if (res == EMoveResult::pastdest)	// if destination height acheived
	{
		// make floor stop sound
		SN_StopSequence (m_Sector, CHAN_FLOOR);

		m_Sector->floordata = NULL;		//jff 2/22/98
		m_Sector->ceilingdata = NULL;	//jff 2/22/98
		Destroy ();		// remove elevator from actives
	}
}